

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

void __thiscall t_go_generator::generate_service(t_go_generator *this,t_service *tservice)

{
  string filename;
  string f_service_name;
  string test_suffix;
  string local_90;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"_test",(allocator *)&local_70);
  std::__cxx11::string::string
            ((string *)&local_90,(string *)&(this->super_t_generator).service_name_);
  t_generator::lowercase(&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  generate_service_interface(this,tservice);
  generate_service_client(this,tservice);
  generate_service_server(this,tservice);
  generate_service_helpers(this,tservice);
  generate_service_remote(this,tservice);
  std::operator<<((ostream *)&this->f_types_,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void t_go_generator::generate_service(t_service* tservice) {
  string test_suffix("_test");
  string filename = lowercase(service_name_);
  string f_service_name;

  generate_service_interface(tservice);
  generate_service_client(tservice);
  generate_service_server(tservice);
  generate_service_helpers(tservice);
  generate_service_remote(tservice);
  f_types_ << endl;
}